

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

int ipc_helper_closed_handle(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar3;
  void *pvVar4;
  undefined8 *extraout_RDX;
  uv_pipe_t *puVar5;
  uv_pipe_t *loop;
  ulong uVar6;
  uv_buf_t uStack_88;
  uv_loop_t *puStack_78;
  uv_buf_t uStack_70;
  sockaddr_in sStack_60;
  uv_loop_t *puStack_50;
  sockaddr_in sStack_40;
  uv_loop_t *puStack_30;
  
  memset(buffer,0x2e,100000);
  large_buf = uv_buf_init(buffer,100000);
  puVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar3,&channel,1);
  if (iVar1 == 0) {
    puVar5 = &channel;
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable((uv_stream_t *)&channel);
    if (iVar1 != 1) goto LAB_001605e7;
    iVar1 = uv_is_writable((uv_stream_t *)&channel);
    if (iVar1 != 1) goto LAB_001605ec;
    iVar1 = uv_is_closing((uv_handle_t *)&channel);
    if (iVar1 != 0) goto LAB_001605f1;
    uVar2 = write_until_data_queued();
    if (uVar2 != 0) {
      send_handle_and_close();
    }
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001605f6;
    if (closed_handle_write != '\0') {
      puVar5 = (uv_pipe_t *)uv_default_loop();
      uv_walk((uv_loop_t *)puVar5,close_walk_cb,(void *)0x0);
      uv_run((uv_loop_t *)puVar5,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00160600;
    }
  }
  else {
    ipc_helper_closed_handle_cold_1();
    puVar5 = (uv_pipe_t *)buffer;
LAB_001605e7:
    ipc_helper_closed_handle_cold_2();
LAB_001605ec:
    ipc_helper_closed_handle_cold_3();
LAB_001605f1:
    ipc_helper_closed_handle_cold_4();
LAB_001605f6:
    ipc_helper_closed_handle_cold_5();
  }
  ipc_helper_closed_handle_cold_6();
LAB_00160600:
  ipc_helper_closed_handle_cold_7();
  uVar6 = 0;
  loop = (uv_pipe_t *)write_reqs;
  puStack_30 = (uv_loop_t *)puVar5;
  do {
    builtin_memcpy(sStack_40.sin_zero,"C\x06\x16",4);
    sStack_40.sin_zero[4] = '\0';
    sStack_40.sin_zero[5] = '\0';
    sStack_40.sin_zero[6] = '\0';
    sStack_40.sin_zero[7] = '\0';
    iVar1 = uv_write((uv_write_t *)loop,(uv_stream_t *)&channel,&large_buf,1,
                     closed_handle_large_write_cb);
    if (iVar1 != 0) {
      sStack_40.sin_zero = (uchar  [8])send_handle_and_close;
      write_until_data_queued_cold_1();
      puStack_50 = (uv_loop_t *)0x16067e;
      puVar3 = uv_default_loop();
      puStack_50 = (uv_loop_t *)0x16068d;
      iVar1 = uv_tcp_init(puVar3,&tcp_server);
      if (iVar1 == 0) {
        puStack_50 = (uv_loop_t *)0x1606a7;
        iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_40);
        if (iVar1 != 0) goto LAB_0016070b;
        puStack_50 = (uv_loop_t *)0x1606be;
        iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStack_40,0);
        if (iVar1 != 0) goto LAB_00160710;
        puStack_50 = (uv_loop_t *)0x1606ef;
        iVar1 = uv_write2(&write_req,(uv_stream_t *)&channel,&large_buf,1,(uv_stream_t *)&tcp_server
                          ,closed_handle_write_cb);
        if (iVar1 == 0) {
          puStack_50 = (uv_loop_t *)0x160701;
          uv_close((uv_handle_t *)&tcp_server,(uv_close_cb)0x0);
          return extraout_EAX;
        }
      }
      else {
        puStack_50 = (uv_loop_t *)0x16070b;
        send_handle_and_close_cold_1();
LAB_0016070b:
        puStack_50 = (uv_loop_t *)0x160710;
        send_handle_and_close_cold_2();
LAB_00160710:
        puStack_50 = (uv_loop_t *)0x160715;
        send_handle_and_close_cold_3();
      }
      puStack_50 = (uv_loop_t *)ipc_helper_bind_twice;
      send_handle_and_close_cold_4();
      puStack_78 = (uv_loop_t *)0x160735;
      puStack_50 = (uv_loop_t *)loop;
      iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_60);
      if (iVar1 == 0) {
        puStack_78 = (uv_loop_t *)0x160742;
        puVar3 = uv_default_loop();
        puStack_78 = (uv_loop_t *)0x160756;
        iVar1 = uv_pipe_init(puVar3,&channel,1);
        if (iVar1 != 0) goto LAB_001608df;
        loop = &channel;
        puStack_78 = (uv_loop_t *)0x16076f;
        uv_pipe_open(&channel,0);
        puStack_78 = (uv_loop_t *)0x160777;
        iVar1 = uv_is_readable((uv_stream_t *)&channel);
        if (iVar1 != 1) goto LAB_001608e4;
        puStack_78 = (uv_loop_t *)0x16078c;
        iVar1 = uv_is_writable((uv_stream_t *)&channel);
        if (iVar1 != 1) goto LAB_001608e9;
        puStack_78 = (uv_loop_t *)0x1607a1;
        iVar1 = uv_is_closing((uv_handle_t *)&channel);
        if (iVar1 != 0) goto LAB_001608ee;
        puStack_78 = (uv_loop_t *)0x1607ba;
        uStack_70 = uv_buf_init("hello\n",6);
        puStack_78 = (uv_loop_t *)0x1607c8;
        puVar3 = uv_default_loop();
        puStack_78 = (uv_loop_t *)0x1607d7;
        iVar1 = uv_tcp_init(puVar3,&tcp_server);
        if (iVar1 != 0) goto LAB_001608f3;
        puStack_78 = (uv_loop_t *)0x1607e4;
        puVar3 = uv_default_loop();
        puStack_78 = (uv_loop_t *)0x1607f3;
        iVar1 = uv_tcp_init(puVar3,&tcp_server2);
        if (iVar1 != 0) goto LAB_001608f8;
        puStack_78 = (uv_loop_t *)0x16080e;
        iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStack_60,0);
        if (iVar1 != 0) goto LAB_001608fd;
        puStack_78 = (uv_loop_t *)0x160829;
        iVar1 = uv_tcp_bind(&tcp_server2,(sockaddr *)&sStack_60,0);
        if (iVar1 != 0) goto LAB_00160902;
        puStack_78 = (uv_loop_t *)0x160856;
        iVar1 = uv_write2(&write_req,(uv_stream_t *)&channel,&uStack_70,1,(uv_stream_t *)&tcp_server
                          ,(uv_write_cb)0x0);
        if (iVar1 != 0) goto LAB_00160907;
        puStack_78 = (uv_loop_t *)0x160883;
        iVar1 = uv_write2(&write_req2,(uv_stream_t *)&channel,&uStack_70,1,
                          (uv_stream_t *)&tcp_server2,(uv_write_cb)0x0);
        if (iVar1 != 0) goto LAB_0016090c;
        puStack_78 = (uv_loop_t *)0x160890;
        puVar3 = uv_default_loop();
        puStack_78 = (uv_loop_t *)0x16089a;
        iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
        if (iVar1 != 0) goto LAB_00160911;
        puStack_78 = (uv_loop_t *)0x1608a3;
        loop = (uv_pipe_t *)uv_default_loop();
        puStack_78 = (uv_loop_t *)0x1608b7;
        uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
        puStack_78 = (uv_loop_t *)0x1608c1;
        uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
        puStack_78 = (uv_loop_t *)0x1608c6;
        puVar3 = uv_default_loop();
        puStack_78 = (uv_loop_t *)0x1608ce;
        iVar1 = uv_loop_close(puVar3);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
        puStack_78 = (uv_loop_t *)0x1608df;
        ipc_helper_bind_twice_cold_1();
LAB_001608df:
        puStack_78 = (uv_loop_t *)0x1608e4;
        ipc_helper_bind_twice_cold_2();
LAB_001608e4:
        puStack_78 = (uv_loop_t *)0x1608e9;
        ipc_helper_bind_twice_cold_3();
LAB_001608e9:
        puStack_78 = (uv_loop_t *)0x1608ee;
        ipc_helper_bind_twice_cold_4();
LAB_001608ee:
        puStack_78 = (uv_loop_t *)0x1608f3;
        ipc_helper_bind_twice_cold_5();
LAB_001608f3:
        puStack_78 = (uv_loop_t *)0x1608f8;
        ipc_helper_bind_twice_cold_6();
LAB_001608f8:
        puStack_78 = (uv_loop_t *)0x1608fd;
        ipc_helper_bind_twice_cold_7();
LAB_001608fd:
        puStack_78 = (uv_loop_t *)0x160902;
        ipc_helper_bind_twice_cold_8();
LAB_00160902:
        puStack_78 = (uv_loop_t *)0x160907;
        ipc_helper_bind_twice_cold_9();
LAB_00160907:
        puStack_78 = (uv_loop_t *)0x16090c;
        ipc_helper_bind_twice_cold_10();
LAB_0016090c:
        puStack_78 = (uv_loop_t *)0x160911;
        ipc_helper_bind_twice_cold_11();
LAB_00160911:
        puStack_78 = (uv_loop_t *)0x160916;
        ipc_helper_bind_twice_cold_12();
      }
      puStack_78 = (uv_loop_t *)ipc_helper_send_zero;
      ipc_helper_bind_twice_cold_13();
      puStack_78 = (uv_loop_t *)loop;
      uStack_88 = uv_buf_init((char *)0x0,0);
      puVar3 = uv_default_loop();
      puVar5 = &channel;
      iVar1 = uv_pipe_init(puVar3,&channel,0);
      if (iVar1 == 0) {
        puVar5 = (uv_pipe_t *)0x0;
        uv_pipe_open(&channel,0);
        iVar1 = uv_is_readable((uv_stream_t *)&channel);
        if (iVar1 != 1) goto LAB_00160a1e;
        iVar1 = uv_is_writable((uv_stream_t *)&channel);
        if (iVar1 != 1) goto LAB_00160a23;
        iVar1 = uv_is_closing((uv_handle_t *)&channel);
        if (iVar1 != 0) goto LAB_00160a28;
        puVar5 = &channel;
        iVar1 = uv_write(&write_req,(uv_stream_t *)&channel,&uStack_88,1,send_zero_write_cb);
        if (iVar1 != 0) goto LAB_00160a2d;
        puVar3 = uv_default_loop();
        puVar5 = (uv_pipe_t *)0x0;
        iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
        if (iVar1 != 0) goto LAB_00160a32;
        if (send_zero_write == 1) {
          puVar3 = uv_default_loop();
          uv_walk(puVar3,close_walk_cb,(void *)0x0);
          puVar5 = (uv_pipe_t *)0x0;
          uv_run(puVar3,UV_RUN_DEFAULT);
          puVar3 = uv_default_loop();
          iVar1 = uv_loop_close(puVar3);
          if (iVar1 == 0) {
            return 0;
          }
          goto LAB_00160a3c;
        }
      }
      else {
        ipc_helper_send_zero_cold_1();
LAB_00160a1e:
        ipc_helper_send_zero_cold_2();
LAB_00160a23:
        ipc_helper_send_zero_cold_3();
LAB_00160a28:
        ipc_helper_send_zero_cold_4();
LAB_00160a2d:
        ipc_helper_send_zero_cold_5();
LAB_00160a32:
        ipc_helper_send_zero_cold_6();
      }
      ipc_helper_send_zero_cold_7();
LAB_00160a3c:
      ipc_helper_send_zero_cold_8();
      if ((int)puVar5 == 0) {
        send_zero_write = send_zero_write + 1;
        return extraout_EAX_00;
      }
      send_zero_write_cb_cold_1();
      pvVar4 = malloc((size_t)puVar5);
      *extraout_RDX = pvVar4;
      extraout_RDX[1] = puVar5;
      return (int)pvVar4;
    }
    if (0x12a < uVar6) break;
    uVar6 = uVar6 + 1;
    loop = (uv_pipe_t *)&(((uv_loop_t *)loop)->wq_async).type;
  } while (channel.write_queue_size == 0);
  return (int)channel.write_queue_size;
}

Assistant:

int ipc_helper_closed_handle(void) {
  int r;

  memset(buffer, '.', LARGE_SIZE);
  large_buf = uv_buf_init(buffer, LARGE_SIZE);

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  if (write_until_data_queued() > 0)
    send_handle_and_close();

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(closed_handle_write == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}